

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixMapfile(unixFile *pFd,i64 nByte)

{
  uint uVar1;
  void *pvVar2;
  unsigned_short uVar3;
  int iVar4;
  void *pvVar5;
  uint *puVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  stat statbuf;
  undefined1 local_c0 [48];
  ulong local_90;
  
  if (0 < pFd->nFetchOut) {
    return 0;
  }
  if ((nByte < 0) &&
     (iVar4 = (*aSyscall[5].pCurrent)((ulong)(uint)pFd->h,local_c0), nByte = local_90, iVar4 != 0))
  {
    return 0x70a;
  }
  uVar8 = pFd->mmapSizeMax;
  if (nByte < pFd->mmapSizeMax) {
    uVar8 = nByte;
  }
  if (uVar8 == pFd->mmapSize) {
    return 0;
  }
  if ((long)uVar8 < 1) {
    if (pFd->pMapRegion == (void *)0x0) {
      return 0;
    }
    (*aSyscall[0x16].pCurrent)(pFd->pMapRegion,pFd->mmapSizeActual);
    pFd->pMapRegion = (void *)0x0;
    pFd->mmapSize = 0;
    pFd->mmapSizeActual = 0;
    return 0;
  }
  uVar1 = pFd->h;
  pvVar2 = pFd->pMapRegion;
  uVar3 = pFd->ctrlFlags;
  if (pvVar2 == (void *)0x0) {
    pcVar10 = "mmap";
  }
  else {
    uVar9 = pFd->mmapSize & 0xfffffffffffffe00;
    if (pFd->mmapSizeActual != uVar9) {
      (*aSyscall[0x16].pCurrent)(uVar9 + (long)pvVar2);
    }
    pvVar5 = (void *)(*aSyscall[0x17].pCurrent)(pvVar2,uVar9,uVar8,1);
    if (1 < (long)pvVar5 + 1U) {
      pcVar10 = "mremap";
      goto LAB_00157d5d;
    }
    (*aSyscall[0x16].pCurrent)(pvVar2,uVar9);
    pcVar10 = "mremap";
    if (pvVar5 != (void *)0x0) goto LAB_00157d5d;
  }
  pvVar5 = (void *)(*aSyscall[0x15].pCurrent)
                             (0,uVar8,(ulong)((uint)((uVar3 & 2) == 0) * 2 + 1),1,(ulong)uVar1,0);
LAB_00157d5d:
  if (pvVar5 == (void *)0xffffffffffffffff) {
    pcVar7 = pFd->zPath;
    puVar6 = (uint *)__errno_location();
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "";
    }
    pvVar5 = (void *)0x0;
    sqlite3_log(0,"os_unix.c:%d: (%d) %s(%s) - %s",0x6c94,(ulong)*puVar6,pcVar10,pcVar7,"");
    pFd->mmapSizeMax = 0;
    uVar8 = 0;
  }
  pFd->pMapRegion = pvVar5;
  pFd->mmapSizeActual = uVar8;
  pFd->mmapSize = uVar8;
  return 0;
}

Assistant:

static int unixMapfile(unixFile *pFd, i64 nByte){
#if SQLITE_MAX_MMAP_SIZE>0
  i64 nMap = nByte;
  int rc;

  assert( nMap>=0 || pFd->nFetchOut==0 );
  if( pFd->nFetchOut>0 ) return SQLITE_OK;

  if( nMap<0 ){
    struct stat statbuf;          /* Low-level file information */
    rc = osFstat(pFd->h, &statbuf);
    if( rc!=SQLITE_OK ){
      return SQLITE_IOERR_FSTAT;
    }
    nMap = statbuf.st_size;
  }
  if( nMap>pFd->mmapSizeMax ){
    nMap = pFd->mmapSizeMax;
  }

  if( nMap!=pFd->mmapSize ){
    if( nMap>0 ){
      unixRemapfile(pFd, nMap);
    }else{
      unixUnmapfile(pFd);
    }
  }
#endif

  return SQLITE_OK;
}